

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string cs_impl::
       to_string<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                 (hash_map *map)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 in_RSI;
  proxy *in_RDI;
  iterator iVar3;
  pair *it;
  const_iterator __end1;
  const_iterator __begin1;
  hash_map *__range1;
  string str;
  const_iterator *in_stack_fffffffffffffed8;
  string *psVar4;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  anon_union_8_1_a8a14541_for_iterator_1 this;
  ctrl_t *local_108;
  string local_d0 [32];
  string local_b0 [8];
  pair *in_stack_ffffffffffffff58;
  undefined1 local_90 [16];
  undefined1 *local_80;
  iterator local_78;
  iterator local_68;
  undefined8 local_58;
  allocator local_49;
  string local_48 [55];
  allocator local_11;
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
          ::empty((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                   *)0x24a351);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"cs::hash_map => {}",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"cs::hash_map => {",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_58 = local_10;
    local_68 = (iterator)
               phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               ::begin(in_stack_fffffffffffffee0);
    iVar3 = (iterator)
            phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
            ::end(in_stack_fffffffffffffee0);
    local_78 = iVar3;
    while( true ) {
      this = iVar3.field_1;
      local_108 = iVar3.ctrl_;
      uVar2 = phmap::priv::operator!=
                        ((const_iterator *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      if (!(bool)uVar2) break;
      in_stack_fffffffffffffee0 =
           (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
            *)phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              ::const_iterator::operator*((const_iterator *)0x24a49e);
      std::pair<cs_impl::any,_cs_impl::any>::pair<const_cs_impl::any,_cs_impl::any,_true>
                ((pair<cs_impl::any,_cs_impl::any> *)this.slot_,
                 (pair<const_cs_impl::any,_cs_impl::any> *)CONCAT17(uVar2,in_stack_fffffffffffffee8)
                );
      local_80 = local_90;
      to_string<std::pair<cs_impl::any,cs_impl::any>>(in_stack_ffffffffffffff58);
      std::operator+((any *)CONCAT17(uVar2,in_stack_fffffffffffffee8),
                     (char *)in_stack_fffffffffffffee0);
      std::__cxx11::string::operator+=(local_48,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::pair<cs_impl::any,_cs_impl::any>::~pair
                ((pair<cs_impl::any,_cs_impl::any> *)in_stack_fffffffffffffee0);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffee0);
      iVar3.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_1)
           (anon_union_8_1_a8a14541_for_iterator_1)this.slot_;
      iVar3.ctrl_ = local_108;
    }
    psVar4 = local_48;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)psVar4);
    std::__cxx11::string::operator+=(local_48,"}");
    std::__cxx11::string::string((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return (string)in_RDI;
}

Assistant:

std::string to_string<cs::hash_map>(const cs::hash_map &map)
	{
		if (map.empty())
			return "cs::hash_map => {}";
		std::string str = "cs::hash_map => {";
		for (const cs::pair &it: map)
			str += cs_impl::to_string(it) + ", ";
		str.resize(str.size() - 2);
		str += "}";
		return std::move(str);
	}